

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O2

void __thiscall
TPZEqnArray<std::complex<float>_>::EqnForward
          (TPZEqnArray<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *F,
          DecomposeType dec)

{
  float fVar1;
  long lVar2;
  ostream *poVar3;
  complex<float> *pcVar4;
  complex<float> *pcVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  complex<float> udiag;
  
  if (this->fSymmetric == EIsSymmetric) {
    uVar6 = 0;
    while( true ) {
      if ((long)this->fNumEq <= (long)uVar6) break;
      iVar8 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar6];
      lVar7 = (long)iVar8;
      pcVar5 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
               super_TPZVec<std::complex<float>_>.fStore;
      fVar1 = *(float *)&pcVar5[lVar7]._M_value;
      if ((((fVar1 == 0.0) && (!NAN(fVar1))) &&
          (fVar1 = *(float *)((long)&pcVar5[lVar7]._M_value + 4), fVar1 == 0.0)) && (!NAN(fVar1))) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ")
        ;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
        poVar3 = std::operator<<(poVar3," Equation = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar6);
        std::endl<char,std::char_traits<char>>(poVar3);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                   ,0x8b);
      }
      if (uVar6 == this->fNumEq - 1) {
        iVar8 = (int)(this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                     super_TPZVec<std::complex<float>_>.fNElements;
      }
      else {
        iVar8 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar6 + 1];
      }
      if ((dec & ~ELUPivot) == ELU) {
        pcVar5 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                 super_TPZVec<std::complex<float>_>.fStore;
        pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar7],0);
        std::complex<float>::operator/=(pcVar4,pcVar5 + lVar7);
      }
      pcVar5 = TPZFMatrix<std::complex<float>_>::operator()
                         (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                  fStore[lVar7],0);
      udiag._M_value = pcVar5->_M_value;
      lVar2 = lVar7 * 8;
      lVar9 = lVar7;
      while( true ) {
        lVar9 = lVar9 + 1;
        if (iVar8 <= lVar9) break;
        std::operator*(&udiag,(complex<float> *)
                              ((long)&(this->fEqValues).
                                      super_TPZManVector<std::complex<float>,_1000>.
                                      super_TPZVec<std::complex<float>_>.fStore[1]._M_value + lVar2)
                      );
        pcVar5 = TPZFMatrix<std::complex<float>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar9],0);
        pcVar5->_M_value =
             CONCAT44((float)(pcVar5->_M_value >> 0x20) - extraout_XMM0_Db_00,
                      (float)pcVar5->_M_value - extraout_XMM0_Da_00);
        lVar2 = lVar2 + 8;
      }
      if (dec == ELDLt) {
        pcVar5 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                 super_TPZVec<std::complex<float>_>.fStore;
        pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar7],0);
        std::complex<float>::operator/=(pcVar4,pcVar5 + lVar7);
      }
      uVar6 = uVar6 + 1;
    }
  }
  else if (this->fSymmetric == EIsNonSymmetric) {
    uVar6 = 1;
    while( true ) {
      if ((long)this->fNumEq <= (long)uVar6) break;
      iVar8 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar6];
      lVar7 = (long)iVar8;
      pcVar5 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
               super_TPZVec<std::complex<float>_>.fStore;
      fVar1 = *(float *)&pcVar5[lVar7]._M_value;
      if (((fVar1 == 0.0) && (!NAN(fVar1))) &&
         ((fVar1 = *(float *)((long)&pcVar5[lVar7]._M_value + 4), fVar1 == 0.0 && (!NAN(fVar1))))) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ")
        ;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
        poVar3 = std::operator<<(poVar3," Equation = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar6);
        std::endl<char,std::char_traits<char>>(poVar3);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                   ,0xa5);
      }
      if (uVar6 == this->fNumEq - 1) {
        iVar8 = (int)(this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                     super_TPZVec<std::complex<float>_>.fNElements;
      }
      else {
        iVar8 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar6 + 1];
      }
      if ((dec & ~ELUPivot) == ELU) {
        pcVar5 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                 super_TPZVec<std::complex<float>_>.fStore;
        pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar7],0);
        std::complex<float>::operator/=(pcVar4,pcVar5 + lVar7);
      }
      pcVar5 = TPZFMatrix<std::complex<float>_>::operator()
                         (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                  fStore[lVar7],0);
      udiag._M_value = pcVar5->_M_value;
      lVar2 = lVar7 * 8;
      while( true ) {
        lVar7 = lVar7 + 1;
        if (iVar8 <= lVar7) break;
        std::operator*(&udiag,(complex<float> *)
                              ((long)&(this->fEqValues).
                                      super_TPZManVector<std::complex<float>,_1000>.
                                      super_TPZVec<std::complex<float>_>.fStore[1]._M_value + lVar2)
                      );
        pcVar5 = TPZFMatrix<std::complex<float>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar7],0);
        pcVar5->_M_value =
             CONCAT44((float)(pcVar5->_M_value >> 0x20) - extraout_XMM0_Db,
                      (float)pcVar5->_M_value - extraout_XMM0_Da);
        lVar2 = lVar2 + 8;
      }
      uVar6 = uVar6 + 2;
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnForward(TPZFMatrix<TVar> & F, DecomposeType dec) {
	int j;
	if(IsSymmetric()==EIsSymmetric){
		
		for(j=0; j<fNumEq; j++) {
			int index = fEqStart[j];
			if(fEqValues[index] == (TVar)0.) {
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			int i;
			//+1 ou +2
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
			/** finalizacao para ldlt */
			if(dec == ELDLt) F(fIndex[index],0) /= fEqValues[index];
		}
	} else if(IsSymmetric()==EIsNonSymmetric) {
		for(j=1; j<fNumEq; j+=2) {
			int index = fEqStart[j];
			
			if(fEqValues[index] == (TVar)0.){
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}          
			
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			//if(fEqStart.NElements()
			
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			
			int i;
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
		}
	}
}